

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintPair.hpp
# Opt level: O0

void __thiscall OpenMD::ConstraintPair::~ConstraintPair(ConstraintPair *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  ConstraintElem *in_stack_ffffffffffffffe0;
  ConstraintElem *this_00;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    ConstraintElem::~ConstraintElem(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1,0x28);
  }
  this_00 = (ConstraintElem *)in_RDI[1];
  if (this_00 != (ConstraintElem *)0x0) {
    ConstraintElem::~ConstraintElem(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

~ConstraintPair() {
      delete consElem1_;
      delete consElem2_;
    }